

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_expr.hpp
# Opt level: O0

rt_expression_interface<double> * __thiscall
viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::substitute
          (rt_binary_expr<viennamath::rt_expression_interface<double>_> *this,
          vector<const_viennamath::rt_expression_interface<double>_*,_std::allocator<const_viennamath::rt_expression_interface<double>_*>_>
          *e,vector<const_viennamath::rt_expression_interface<double>_*,_std::allocator<const_viennamath::rt_expression_interface<double>_*>_>
             *repl)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_type sVar5;
  const_reference pprVar6;
  undefined4 extraout_var;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> *this_00;
  element_type *peVar7;
  undefined4 extraout_var_00;
  element_type *peVar8;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ulong local_30;
  size_t i;
  vector<const_viennamath::rt_expression_interface<double>_*,_std::allocator<const_viennamath::rt_expression_interface<double>_*>_>
  *repl_local;
  vector<const_viennamath::rt_expression_interface<double>_*,_std::allocator<const_viennamath::rt_expression_interface<double>_*>_>
  *e_local;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> *this_local;
  
  local_30 = 0;
  while( true ) {
    sVar5 = std::
            vector<const_viennamath::rt_expression_interface<double>_*,_std::allocator<const_viennamath::rt_expression_interface<double>_*>_>
            ::size(e);
    if (sVar5 <= local_30) {
      this_00 = (rt_binary_expr<viennamath::rt_expression_interface<double>_> *)operator_new(0x20);
      peVar7 = std::auto_ptr<viennamath::rt_expression_interface<double>_>::operator->(&this->lhs_);
      iVar2 = (*peVar7->_vptr_rt_expression_interface[0xf])(peVar7,e,repl);
      peVar8 = std::
               auto_ptr<viennamath::op_interface<viennamath::rt_expression_interface<double>_>_>::
               operator->(&this->op_);
      iVar3 = (*peVar8->_vptr_op_interface[2])();
      peVar7 = std::auto_ptr<viennamath::rt_expression_interface<double>_>::operator->(&this->rhs_);
      iVar4 = (*peVar7->_vptr_rt_expression_interface[0xf])(peVar7,e,repl);
      rt_binary_expr(this_00,(rt_expression_interface<double> *)CONCAT44(extraout_var_00,iVar2),
                     (op_interface_type *)CONCAT44(extraout_var_01,iVar3),
                     (rt_expression_interface<double> *)CONCAT44(extraout_var_02,iVar4));
      return &this_00->super_rt_expression_interface<double>;
    }
    pprVar6 = std::
              vector<const_viennamath::rt_expression_interface<double>_*,_std::allocator<const_viennamath::rt_expression_interface<double>_*>_>
              ::operator[](e,local_30);
    uVar1 = (*(this->super_rt_expression_interface<double>)._vptr_rt_expression_interface[0xb])
                      (this,*pprVar6);
    if ((uVar1 & 1) != 0) break;
    local_30 = local_30 + 1;
  }
  pprVar6 = std::
            vector<const_viennamath::rt_expression_interface<double>_*,_std::allocator<const_viennamath::rt_expression_interface<double>_*>_>
            ::operator[](repl,local_30);
  iVar2 = (*(*pprVar6)->_vptr_rt_expression_interface[2])();
  return (rt_expression_interface<double> *)CONCAT44(extraout_var,iVar2);
}

Assistant:

InterfaceType * substitute(std::vector<const InterfaceType *> const &  e,
                                 std::vector<const InterfaceType *> const &  repl) const
      {
        for (size_t i=0; i<e.size(); ++i)
          if (deep_equal(e[i]))
            return repl[i]->clone();

        return new rt_binary_expr(lhs_->substitute(e, repl),
                               op_->clone(),
                               rhs_->substitute(e, repl) );
      }